

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pos_tagger_test.cpp
# Opt level: O2

void __thiscall PosTaggerTest_Test_Test::TestBody(PosTaggerTest_Test_Test *this)

{
  AssertHelper AStack_178;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  string s;
  String local_148;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  res;
  AssertionResult gtest_ar_;
  MixSegment tagger;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s,"../dict/jieba.dict.utf8",(allocator<char> *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&res,"../dict/hmm_model.utf8",(allocator<char> *)&local_170);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_,"",(allocator<char> *)&AStack_178);
  cppjieba::MixSegment::MixSegment(&tagger,&s,(string *)&res,(string *)&gtest_ar_);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  std::__cxx11::string::~string((string *)&res);
  std::__cxx11::string::~string((string *)&s);
  res.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  res.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  res.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s,anon_var_dwarf_c2979,(allocator<char> *)&gtest_ar_);
  cppjieba::MixSegment::Tag(&tagger,&s,&res);
  std::__cxx11::string::~string((string *)&s);
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  std::operator<<(&s,&res);
  gtest_ar_.success_ = std::operator==(&s,anon_var_dwarf_c29a7);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_170);
    testing::internal::GetBoolAssertionFailureMessage
              ((internal *)&local_148,&gtest_ar_,"s == ANS_TEST1","false","true");
    testing::internal::AssertHelper::AssertHelper
              (&AStack_178,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/test/unittest/pos_tagger_test.cpp"
               ,0x16,local_148.c_str_);
    testing::internal::AssertHelper::operator=(&AStack_178,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(&AStack_178);
    testing::internal::String::~String(&local_148);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_170);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__cxx11::string::~string((string *)&s);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&res);
  cppjieba::MixSegment::~MixSegment(&tagger);
  return;
}

Assistant:

TEST(PosTaggerTest, Test) {
  MixSegment tagger("../dict/jieba.dict.utf8", "../dict/hmm_model.utf8");
  {
    vector<pair<string, string> > res;
    tagger.Tag(QUERY_TEST1, res);
    string s;
    s << res;
    ASSERT_TRUE(s == ANS_TEST1);
  }
}